

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_writer.h
# Opt level: O2

void __thiscall
cppwinrt::writer_base<cppwinrt::writer>::write_segment<char[8],std::__cxx11::string>
          (writer_base<cppwinrt::writer> *this,string_view *value,char (*first) [8],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest)

{
  char cVar1;
  size_type __n;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  __n = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of(value,"^%@",0);
  if (__n == 0xffffffffffffffff) {
    __assert_fail("offset != std::string_view::npos",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/text_writer.h"
                  ,0x125,
                  "void cppwinrt::writer_base<cppwinrt::writer>::write_segment(const std::string_view &, const First &, const Rest &...) [T = cppwinrt::writer, First = char[8], Rest = <std::basic_string<char>>]"
                 );
  }
  local_38 = std::basic_string_view<char,_std::char_traits<char>_>::substr(value,0,__n);
  write_impl(this,&local_38);
  cVar1 = value->_M_str[__n];
  if (cVar1 == '%') {
    local_38._M_len = strlen(*first);
    local_38._M_str = *first;
    write_impl(this,&local_38);
  }
  else {
    if (cVar1 == '^') {
      if (__n != value->_M_len - 1) {
        write_impl(this,value->_M_str[__n + 1]);
        local_38 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                             (value,__n + 2,0xffffffffffffffff);
        write_segment<char[8],std::__cxx11::string>(this,&local_38,first,rest);
        return;
      }
      __assert_fail("offset != value.size() - 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/text_writer.h"
                    ,0x12a,
                    "void cppwinrt::writer_base<cppwinrt::writer>::write_segment(const std::string_view &, const First &, const Rest &...) [T = cppwinrt::writer, First = char[8], Rest = <std::basic_string<char>>]"
                   );
    }
    local_38._M_len = strlen(*first);
    local_38._M_str = *first;
    writer::write_code((writer *)this,&local_38);
  }
  local_38 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                       (value,__n + 1,0xffffffffffffffff);
  write_segment<std::__cxx11::string>(this,&local_38,rest);
  return;
}

Assistant:

void write_segment(std::string_view const& value, First const& first, Rest const&... rest)
        {
            auto offset = value.find_first_of("^%@");
            assert(offset != std::string_view::npos);
            write(value.substr(0, offset));

            if (value[offset] == '^')
            {
                assert(offset != value.size() - 1);

                write(value[offset + 1]);
                write_segment(value.substr(offset + 2), first, rest...);
            }
            else
            {
                if (value[offset] == '%')
                {
                    static_cast<T*>(this)->write(first);
                }
                else
                {
                    if constexpr (std::is_convertible_v<First, std::string_view>)
                    {
                        static_cast<T*>(this)->write_code(first);
                    }
                    else
                    {
                        assert(false); // '@' placeholders are only for text.
                    }
                }

                write_segment(value.substr(offset + 1), rest...);
            }
        }